

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O2

void __thiscall CircBufTest::CircBufTest(CircBufTest *this,int test_id)

{
  char name [32];
  char acStack_58 [40];
  
  TestCase::TestCase(&this->super_TestCase,"CircBuf");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR__CircBufTest_00109c88;
  this->mTest = test_id;
  JetHead::CircularBuffer::CircularBuffer(&this->gbuff,0x80);
  Condition::Condition(&this->gbuff_cond);
  Mutex::Mutex(&this->gbuff_mutex,false);
  sprintf(acStack_58,"Circular Buffer Test %d",test_id);
  std::__cxx11::string::assign((char *)&(this->super_TestCase).mTestName);
  return;
}

Assistant:

CircBufTest::CircBufTest(int test_id)
		: TestCase("CircBuf"), mTest(test_id), gbuff(BUFFER_SIZE)
{

	char name[32];

	sprintf( name, "Circular Buffer Test %d", test_id);

	SetTestName( name );

}